

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_logical_operator.cpp
# Opt level: O2

unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> __thiscall
duckdb::LogicalReset::Deserialize(LogicalReset *this,Deserializer *deserializer)

{
  SetScope scope_p;
  LogicalReset *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  Deserializer::ReadPropertyWithDefault<std::__cxx11::string>(&local_58,deserializer,200,"name");
  scope_p = Deserializer::ReadProperty<duckdb::SetScope>(deserializer,0xc9,"scope");
  this_00 = (LogicalReset *)operator_new(0x90);
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p == &local_58.field_2) {
    local_38.field_2._8_8_ = local_58.field_2._8_8_;
  }
  else {
    local_38._M_dataplus._M_p = local_58._M_dataplus._M_p;
  }
  local_38._M_string_length = local_58._M_string_length;
  local_58._M_string_length = 0;
  local_58.field_2._M_local_buf[0] = '\0';
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  LogicalReset(this_00,&local_38,scope_p);
  ::std::__cxx11::string::~string((string *)&local_38);
  (this->super_LogicalOperator)._vptr_LogicalOperator = (_func_int **)this_00;
  ::std::__cxx11::string::~string((string *)&local_58);
  return (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
         (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)this;
}

Assistant:

unique_ptr<LogicalOperator> LogicalReset::Deserialize(Deserializer &deserializer) {
	auto name = deserializer.ReadPropertyWithDefault<string>(200, "name");
	auto scope = deserializer.ReadProperty<SetScope>(201, "scope");
	auto result = duckdb::unique_ptr<LogicalReset>(new LogicalReset(std::move(name), scope));
	return std::move(result);
}